

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

void __thiscall
Assimp::AssbinExport::WriteBinaryDump
          (AssbinExport *this,char *pFile,IOSystem *pIOSystem,aiScene *pScene)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined4 extraout_var_00;
  void *pvVar3;
  void *pvVar4;
  DeadlyImportError *this_00;
  allocator<char> local_269;
  string local_268;
  int local_244;
  void *pvStack_240;
  int res;
  uint8_t *compressedBuffer;
  uLongf compressedSize;
  uLongf uncompressedSize;
  undefined1 local_218 [8];
  AssbinChunkWriter uncompressedStream;
  char local_1d8 [6];
  char cmd [2];
  char buff [256];
  ushort local_cc;
  ushort local_ca;
  uint local_c8;
  uint local_c4 [3];
  char local_b8 [8];
  char s [64];
  tm *p;
  tm now;
  time_t tt;
  IOStream *out;
  aiScene *pScene_local;
  IOSystem *pIOSystem_local;
  char *pFile_local;
  AssbinExport *this_local;
  IOStream *stream;
  
  iVar1 = (*pIOSystem->_vptr_IOSystem[4])(pIOSystem,pFile,"wb");
  stream = (IOStream *)CONCAT44(extraout_var,iVar1);
  if (stream != (IOStream *)0x0) {
    now.tm_zone = (char *)time((time_t *)0x0);
    s._56_8_ = gmtime_r((time_t *)&now.tm_zone,(tm *)&p);
    memset(local_b8,0,0x40);
    pcVar2 = asctime((tm *)s._56_8_);
    snprintf(local_b8,0x40,"ASSIMP.binary-dump.%s",pcVar2);
    (*stream->_vptr_IOStream[3])(stream,local_b8,0x2c,1);
    local_c4[2] = 1;
    Write<unsigned_int>(stream,local_c4 + 2);
    local_c4[1] = 0;
    Write<unsigned_int>(stream,local_c4 + 1);
    local_c4[0] = aiGetVersionRevision();
    Write<unsigned_int>(stream,local_c4);
    local_c8 = aiGetCompileFlags();
    Write<unsigned_int>(stream,&local_c8);
    local_ca = (ushort)(this->shortened & 1);
    Write<unsigned_short>(stream,&local_ca);
    local_cc = (ushort)(this->compressed & 1);
    Write<unsigned_short>(stream,&local_cc);
    strncpy(local_1d8,pFile,0x100);
    (*stream->_vptr_IOStream[3])(stream,local_1d8,1,0x100);
    memset((void *)((long)&uncompressedStream.initial + 6),0,2);
    strncpy(local_1d8,(char *)((long)&uncompressedStream.initial + 6),0x80);
    (*stream->_vptr_IOStream[3])(stream,local_1d8,1,0x80);
    memset(local_1d8,0xcd,0x40);
    (*stream->_vptr_IOStream[3])(stream,local_1d8,1,0x40);
    iVar1 = (*stream->_vptr_IOStream[5])();
    if (CONCAT44(extraout_var_00,iVar1) != 0x200) {
      __assert_fail("out->Tell() == 512",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinExporter.cpp"
                    ,0x324,
                    "void Assimp::AssbinExport::WriteBinaryDump(const char *, IOSystem *, const aiScene *)"
                   );
    }
    if ((this->compressed & 1U) == 0) {
      WriteBinaryScene(this,stream,pScene);
    }
    else {
      AssbinChunkWriter::AssbinChunkWriter((AssbinChunkWriter *)local_218,(IOStream *)0x0,0,0x1000);
      WriteBinaryScene(this,(IOStream *)local_218,pScene);
      compressedSize = AssbinChunkWriter::Tell((AssbinChunkWriter *)local_218);
      compressedBuffer = (uint8_t *)compressBound(compressedSize);
      pvVar3 = operator_new__((ulong)compressedBuffer);
      pvStack_240 = pvVar3;
      pvVar4 = AssbinChunkWriter::GetBufferPointer((AssbinChunkWriter *)local_218);
      local_244 = compress2(pvVar3,&compressedBuffer,pvVar4,compressedSize,9);
      if (local_244 != 0) {
        if (pvStack_240 != (void *)0x0) {
          operator_delete__(pvStack_240);
        }
        (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,stream);
        this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_268,"Compression failed.",&local_269);
        DeadlyImportError::DeadlyImportError(this_00,&local_268);
        __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
      }
      (*stream->_vptr_IOStream[3])(stream,&compressedSize,4,1);
      (*stream->_vptr_IOStream[3])(stream,pvStack_240,1,compressedBuffer);
      if (pvStack_240 != (void *)0x0) {
        operator_delete__(pvStack_240);
      }
      AssbinChunkWriter::~AssbinChunkWriter((AssbinChunkWriter *)local_218);
    }
    (*pIOSystem->_vptr_IOSystem[5])(pIOSystem,stream);
  }
  return;
}

Assistant:

void WriteBinaryDump(const char* pFile, IOSystem* pIOSystem, const aiScene* pScene)
    {
        IOStream * out = pIOSystem->Open( pFile, "wb" );
        if (!out) return;

        time_t tt = time(NULL);
#if _WIN32
        tm* p     = gmtime(&tt);
#else
        struct tm now;
        tm* p = gmtime_r(&tt, &now);
#endif

        // header
        char s[64];
        memset( s, 0, 64 );
#if _MSC_VER >= 1400
        sprintf_s(s,"ASSIMP.binary-dump.%s",asctime(p));
#else
        ai_snprintf(s,64,"ASSIMP.binary-dump.%s",asctime(p));
#endif
        out->Write( s, 44, 1 );
        // == 44 bytes

        Write<unsigned int>( out, ASSBIN_VERSION_MAJOR );
        Write<unsigned int>( out, ASSBIN_VERSION_MINOR );
        Write<unsigned int>( out, aiGetVersionRevision() );
        Write<unsigned int>( out, aiGetCompileFlags() );
        Write<uint16_t>( out, shortened );
        Write<uint16_t>( out, compressed );
        // ==  20 bytes

        char buff[256];
        strncpy(buff,pFile,256);
        out->Write(buff,sizeof(char),256);

        char cmd[] = "\0";
        strncpy(buff,cmd,128);
        out->Write(buff,sizeof(char),128);

        // leave 64 bytes free for future extensions
        memset(buff,0xcd,64);
        out->Write(buff,sizeof(char),64);
        // == 435 bytes

        // ==== total header size: 512 bytes
        ai_assert( out->Tell() == ASSBIN_HEADER_LENGTH );

        // Up to here the data is uncompressed. For compressed files, the rest
        // is compressed using standard DEFLATE from zlib.
        if (compressed)
        {
            AssbinChunkWriter uncompressedStream( NULL, 0 );
            WriteBinaryScene( &uncompressedStream, pScene );

            uLongf uncompressedSize = static_cast<uLongf>(uncompressedStream.Tell());
            uLongf compressedSize = (uLongf)compressBound(uncompressedSize);
            uint8_t* compressedBuffer = new uint8_t[ compressedSize ];

            int res = compress2( compressedBuffer, &compressedSize, (const Bytef*)uncompressedStream.GetBufferPointer(), uncompressedSize, 9 );
            if(res != Z_OK)
            {
                delete [] compressedBuffer;
                pIOSystem->Close(out);
                throw DeadlyExportError("Compression failed.");
            }

            out->Write( &uncompressedSize, sizeof(uint32_t), 1 );
            out->Write( compressedBuffer, sizeof(char), compressedSize );

            delete[] compressedBuffer;
        }
        else
        {
            WriteBinaryScene( out, pScene );
        }

        pIOSystem->Close( out );
    }